

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  CommandOptions Options;
  CommandOptions local_e8;
  Result_t result;
  char *local_78;
  
  Kumu::Result_t::Result_t(&result,(Result_t *)&Kumu::RESULT_FAIL);
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner(_stdout);
  }
  if (Options.help_flag == true) {
    usage(_stdout);
  }
  iVar1 = 0;
  if ((Options.version_flag != false) || (Options.help_flag != false)) goto LAB_001045ff;
  if (Options.error_flag == true) {
    fprintf(_stderr,"There was a problem. Type %s -h for help.\n","kmfilegen");
    iVar1 = 3;
    goto LAB_001045ff;
  }
  if (Options.mode == MMT_VAL_WRITE) {
    ReadValidateWriteLargeFile(&local_e8);
    Kumu::Result_t::operator=(&result,(Result_t *)&local_e8);
LAB_001045e6:
    Kumu::Result_t::~Result_t((Result_t *)&local_e8);
  }
  else {
    if (Options.mode == MMT_VALIDATE) {
      ValidateLargeFile(&local_e8);
      Kumu::Result_t::operator=(&result,(Result_t *)&local_e8);
      goto LAB_001045e6;
    }
    if (Options.mode == MMT_CREATE) {
      CreateLargeFile(&local_e8);
      Kumu::Result_t::operator=(&result,(Result_t *)&local_e8);
      goto LAB_001045e6;
    }
  }
  iVar1 = 0;
  if (_result != Kumu::RESULT_OK) {
    fputs("Program stopped on error.\n",_stderr);
    iVar1 = 1;
    if (_result != Kumu::RESULT_FAIL) {
      fputs(local_78,_stderr);
      fputc(10,_stderr);
    }
  }
LAB_001045ff:
  CommandOptions::~CommandOptions(&Options);
  Kumu::Result_t::~Result_t(&result);
  return iVar1;
}

Assistant:

int
main(int argc, const char **argv)
{
  Result_t result = RESULT_FAIL;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  switch ( Options.mode )
    {

    case MMT_CREATE:
      result = CreateLargeFile(Options);
      break;

    case MMT_VALIDATE:
      result = ValidateLargeFile(Options);
      break;

    case MMT_VAL_WRITE:
      result = ReadValidateWriteLargeFile(Options);
      break;
    }

  if ( result != RESULT_OK )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result.Label(), stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}